

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

bool __thiscall
Hospital::Existence_Of_Password
          (Hospital *this,string *Password,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  pointer pNVar4;
  pointer pDVar5;
  pointer pPVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  string local_60;
  vector<Patient,_std::allocator<Patient>_> *local_40;
  vector<Doctor,_std::allocator<Doctor>_> *local_38;
  
  pNVar4 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar8 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
          super__Vector_impl_data._M_finish != pNVar4;
  local_40 = All_Of_Patients;
  local_38 = All_Of_Doctors;
  if (bVar8) {
    lVar3 = 0;
    uVar7 = 0;
    do {
      Human::Password_Getter_abi_cxx11_
                (&local_60,(Human *)((long)&(pNVar4->super_Human).Id._M_dataplus._M_p + lVar3));
      if (local_60._M_string_length == Password->_M_string_length) {
        if (local_60._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar1 = bcmp(local_60._M_dataplus._M_p,(Password->_M_dataplus)._M_p,
                       local_60._M_string_length);
          bVar9 = iVar1 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        if (bVar8) {
          return true;
        }
        break;
      }
      uVar7 = uVar7 + 1;
      pNVar4 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar4 >> 3) * -0x7d05f417d05f417d;
      lVar3 = lVar3 + 0x158;
      bVar9 = uVar2 - uVar7 != 0;
      bVar8 = uVar7 <= uVar2 && bVar9;
    } while (uVar7 <= uVar2 && bVar9);
  }
  pDVar5 = (local_38->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar8 = (local_38->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
          super__Vector_impl_data._M_finish != pDVar5;
  if (bVar8) {
    lVar3 = 0;
    uVar7 = 0;
    do {
      Human::Password_Getter_abi_cxx11_
                (&local_60,(Human *)((long)&(pDVar5->super_Human).Id._M_dataplus._M_p + lVar3));
      if (local_60._M_string_length == Password->_M_string_length) {
        if (local_60._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar1 = bcmp(local_60._M_dataplus._M_p,(Password->_M_dataplus)._M_p,
                       local_60._M_string_length);
          bVar9 = iVar1 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        if (bVar8) {
          return true;
        }
        break;
      }
      uVar7 = uVar7 + 1;
      pDVar5 = (local_38->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(local_38->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pDVar5 >> 3) * 0x51b3bea3677d46cf;
      lVar3 = lVar3 + 0x178;
      bVar9 = uVar2 - uVar7 != 0;
      bVar8 = uVar7 <= uVar2 && bVar9;
    } while (uVar7 <= uVar2 && bVar9);
  }
  pPVar6 = (local_40->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar8 = (local_40->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
          super__Vector_impl_data._M_finish != pPVar6;
  if (bVar8) {
    lVar3 = 0;
    uVar7 = 0;
    do {
      Human::Password_Getter_abi_cxx11_
                (&local_60,(Human *)((long)&(pPVar6->super_Human).Id._M_dataplus._M_p + lVar3));
      if (local_60._M_string_length == Password->_M_string_length) {
        if (local_60._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar1 = bcmp(local_60._M_dataplus._M_p,(Password->_M_dataplus)._M_p,
                       local_60._M_string_length);
          bVar9 = iVar1 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        return bVar8;
      }
      uVar7 = uVar7 + 1;
      pPVar6 = (local_40->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(local_40->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar6 >> 4) * -0x30c30c30c30c30c3;
      lVar3 = lVar3 + 0x150;
      bVar9 = uVar2 - uVar7 != 0;
      bVar8 = uVar7 <= uVar2 && bVar9;
    } while (uVar7 <= uVar2 && bVar9);
  }
  return bVar8;
}

Assistant:

bool Hospital:: Existence_Of_Password (string Password , vector<Nurse> All_Of_Nurses , vector<Doctor> All_Of_Doctors , vector<Patient>All_Of_Patients ){

    for (int i = 0; i <All_Of_Nurses.size() ; ++i) {
        if (All_Of_Nurses[i].Password_Getter() == Password) return true;
    }
    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if (All_Of_Doctors[i].Password_Getter()  == Password) return true;
    }
    for (int i = 0; i <All_Of_Patients.size() ; ++i) {
        if (All_Of_Patients[i].Password_Getter()  == Password) return true;
    }
    return false;
}